

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ccb39::PeerManagerImpl::ProcessInvalidTx
          (PeerManagerImpl *this,NodeId nodeid,CTransactionRef *ptx,TxValidationState *state,
          bool maybe_add_extra_compact_tx)

{
  TxValidationResult TVar1;
  element_type *peVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pvVar6;
  pointer puVar7;
  pointer puVar8;
  bool bVar9;
  int iVar10;
  CRollingBloomFilter *pCVar11;
  size_t sVar12;
  ulong uVar13;
  pointer pvVar14;
  string *message;
  long lVar15;
  Wtxid *wtxid;
  pointer pCVar16;
  ulong uVar17;
  const_iterator it;
  pointer pCVar18;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  NodeId nodeid_local;
  string local_98;
  PeerRef peer;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nodeid_local = nodeid;
  bVar9 = ::LogAcceptCategory(MEMPOOLREJ,(Level)nodeid);
  if (bVar9) {
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)&stack0xffffffffffffffa8,
               (base_blob<256u> *)
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                hash);
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)&peer,
               (base_blob<256u> *)
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b5871;
    ValidationState<TxValidationResult>::ToString_abi_cxx11_
              (&local_98,&state->super_ValidationState<TxValidationResult>);
    logging_function._M_str = "ProcessInvalidTx";
    logging_function._M_len = 0x10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
    ;
    source_file._M_len = 0x5b;
    LogPrintf_<std::__cxx11::string,std::__cxx11::string,long,std::__cxx11::string>
              (logging_function,source_file,0xc96,MEMPOOLREJ,0x6a01c9,
               (char *)&stack0xffffffffffffffa8,(string *)&peer,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nodeid_local,
               (long *)&local_98,pbVar19);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&peer);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  TVar1 = (state->super_ValidationState<TxValidationResult>).m_result;
  if (TVar1 != TX_MISSING_INPUTS) {
    if (TVar1 != TX_WITNESS_STRIPPED) {
      if (TVar1 == TX_RECONSIDERABLE) {
        pCVar11 = RecentRejectsReconsiderableFilter(this);
      }
      else {
        pCVar11 = RecentRejectsFilter(this);
      }
      vKey.m_data = &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->m_witness_hash;
      vKey.m_size = 0x20;
      CRollingBloomFilter::insert(pCVar11,vKey);
      TxRequestTracker::ForgetTxHash
                (&this->m_txrequest,
                 &(((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   )->m_witness_hash).m_wrapped);
      if (((state->super_ValidationState<TxValidationResult>).m_result == TX_INPUTS_NOT_STANDARD) &&
         (((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          m_has_witness == true)) {
        pCVar11 = RecentRejectsFilter(this);
        vKey_00.m_data =
             &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              hash;
        vKey_00.m_size = 0x20;
        CRollingBloomFilter::insert(pCVar11,vKey_00);
        TxRequestTracker::ForgetTxHash
                  (&this->m_txrequest,
                   &(((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->hash).m_wrapped);
      }
      if (maybe_add_extra_compact_tx) {
        peVar2 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        pCVar16 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar4 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        uVar13 = (long)pCVar3 + (0x1f - (long)pCVar16) & 0xfffffffffffffff0;
        if (pCVar3 == pCVar16) {
          uVar13 = 0;
        }
        pCVar18 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar5 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar17 = (long)pCVar4 + (0x1f - (long)pCVar18) & 0xfffffffffffffff0;
        if (pCVar4 == pCVar18) {
          uVar17 = 0;
        }
        uVar17 = uVar17 + uVar13;
        for (; pCVar18 != pCVar5; pCVar18 = pCVar18 + 1) {
          sVar12 = RecursiveDynamicUsage(&pCVar18->scriptSig);
          pvVar6 = *(pointer *)
                    ((long)&(pCVar18->scriptWitness).stack.
                            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                            ._M_impl.super__Vector_impl_data + 0x10);
          pvVar14 = (pCVar18->scriptWitness).stack.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = 0;
          if (pvVar6 != pvVar14) {
            uVar13 = (long)pvVar6 + (0x1f - (long)pvVar14) & 0xfffffffffffffff0;
          }
          lVar15 = uVar13 + sVar12;
          for (; pvVar14 !=
                 *(pointer *)
                  ((long)&(pCVar18->scriptWitness).stack.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data + 8); pvVar14 = pvVar14 + 1) {
            puVar7 = (pvVar14->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            puVar8 = (pvVar14->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar13 = 0;
            if (puVar7 != puVar8) {
              uVar13 = (ulong)(puVar7 + (0x1f - (long)puVar8)) & 0xfffffffffffffff0;
            }
            lVar15 = lVar15 + uVar13;
          }
          uVar17 = uVar17 + lVar15;
        }
        pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (; pCVar16 != pCVar3; pCVar16 = pCVar16 + 1) {
          sVar12 = RecursiveDynamicUsage(&pCVar16->scriptPubKey);
          uVar17 = uVar17 + sVar12;
        }
        if (uVar17 < 100000) {
          AddToCompactExtraTransactions(this,ptx);
        }
      }
    }
    GetPeerRef((PeerManagerImpl *)&peer,(NodeId)this);
    if (((state->super_ValidationState<TxValidationResult>).m_result == TX_CONSENSUS) &&
       (peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffffa8,"",(allocator<char> *)&local_98);
      Misbehaving((PeerManagerImpl *)
                  peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,(Peer *)&stack0xffffffffffffffa8,message);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&peer.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((state->super_ValidationState<TxValidationResult>).m_result != TX_MISSING_INPUTS) {
      wtxid = &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               m_witness_hash;
      iVar10 = TxOrphanage::EraseTx(&this->m_orphanage,wtxid);
      if (0 < iVar10) {
        bVar9 = ::LogAcceptCategory(TXPACKAGES,(Level)wtxid);
        if (bVar9) {
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&stack0xffffffffffffffa8,
                     (base_blob<256u> *)
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->hash);
          pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b5b1b;
          base_blob<256u>::ToString_abi_cxx11_
                    ((string *)&peer,
                     (base_blob<256u> *)
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_witness_hash);
          logging_function_00._M_str = "ProcessInvalidTx";
          logging_function_00._M_len = 0x10;
          source_file_00._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
          ;
          source_file_00._M_len = 0x5b;
          LogPrintf_<std::__cxx11::string,std::__cxx11::string>
                    (logging_function_00,source_file_00,0xcc9,TXPACKAGES,0x6a01fa,
                     (char *)&stack0xffffffffffffffa8,(string *)&peer,pbVar19);
          std::__cxx11::string::~string((string *)&peer);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessInvalidTx(NodeId nodeid, const CTransactionRef& ptx, const TxValidationState& state,
                                       bool maybe_add_extra_compact_tx)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    LogDebug(BCLog::MEMPOOLREJ, "%s (wtxid=%s) from peer=%d was not accepted: %s\n",
        ptx->GetHash().ToString(),
        ptx->GetWitnessHash().ToString(),
        nodeid,
        state.ToString());

    if (state.GetResult() == TxValidationResult::TX_MISSING_INPUTS) {
        return;
    } else if (state.GetResult() != TxValidationResult::TX_WITNESS_STRIPPED) {
        // We can add the wtxid of this transaction to our reject filter.
        // Do not add txids of witness transactions or witness-stripped
        // transactions to the filter, as they can have been malleated;
        // adding such txids to the reject filter would potentially
        // interfere with relay of valid transactions from peers that
        // do not support wtxid-based relay. See
        // https://github.com/bitcoin/bitcoin/issues/8279 for details.
        // We can remove this restriction (and always add wtxids to
        // the filter even for witness stripped transactions) once
        // wtxid-based relay is broadly deployed.
        // See also comments in https://github.com/bitcoin/bitcoin/pull/18044#discussion_r443419034
        // for concerns around weakening security of unupgraded nodes
        // if we start doing this too early.
        if (state.GetResult() == TxValidationResult::TX_RECONSIDERABLE) {
            // If the result is TX_RECONSIDERABLE, add it to m_lazy_recent_rejects_reconsiderable
            // because we should not download or submit this transaction by itself again, but may
            // submit it as part of a package later.
            RecentRejectsReconsiderableFilter().insert(ptx->GetWitnessHash().ToUint256());
        } else {
            RecentRejectsFilter().insert(ptx->GetWitnessHash().ToUint256());
        }
        m_txrequest.ForgetTxHash(ptx->GetWitnessHash());
        // If the transaction failed for TX_INPUTS_NOT_STANDARD,
        // then we know that the witness was irrelevant to the policy
        // failure, since this check depends only on the txid
        // (the scriptPubKey being spent is covered by the txid).
        // Add the txid to the reject filter to prevent repeated
        // processing of this transaction in the event that child
        // transactions are later received (resulting in
        // parent-fetching by txid via the orphan-handling logic).
        // We only add the txid if it differs from the wtxid, to avoid wasting entries in the
        // rolling bloom filter.
        if (state.GetResult() == TxValidationResult::TX_INPUTS_NOT_STANDARD && ptx->HasWitness()) {
            RecentRejectsFilter().insert(ptx->GetHash().ToUint256());
            m_txrequest.ForgetTxHash(ptx->GetHash());
        }
        if (maybe_add_extra_compact_tx && RecursiveDynamicUsage(*ptx) < 100000) {
            AddToCompactExtraTransactions(ptx);
        }
    }

    MaybePunishNodeForTx(nodeid, state);

    // If the tx failed in ProcessOrphanTx, it should be removed from the orphanage unless the
    // tx was still missing inputs. If the tx was not in the orphanage, EraseTx does nothing and returns 0.
    if (Assume(state.GetResult() != TxValidationResult::TX_MISSING_INPUTS) && m_orphanage.EraseTx(ptx->GetWitnessHash()) > 0) {
        LogDebug(BCLog::TXPACKAGES, "   removed orphan tx %s (wtxid=%s)\n", ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString());
    }
}